

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBase.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
adios2::format::BPBase::GetTransportIDs
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          BPBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *transportsTypes)

{
  pointer *ppuVar1;
  pointer pbVar2;
  pointer pcVar3;
  iterator __position;
  int iVar4;
  string *transportType;
  pointer pbVar5;
  uchar local_51;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (__return_storage_ptr__,
             (long)(transportsTypes->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(transportsTypes->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar5 = (transportsTypes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (transportsTypes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar2) {
    do {
      pcVar3 = (pbVar5->_M_dataplus)._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar3,pcVar3 + pbVar5->_M_string_length);
      iVar4 = std::__cxx11::string::compare((char *)local_50);
      if (iVar4 == 0) {
        local_51 = 0xff;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)local_50);
        if (iVar4 == 0) {
          local_51 = '\x02';
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)local_50);
          if (iVar4 == 0) {
            local_51 = '\x1a';
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)local_50);
            if (iVar4 == 0) {
              local_51 = '\x1b';
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)local_50);
              local_51 = 0xfe;
              if (iVar4 == 0) {
                local_51 = '\x1c';
              }
            }
          }
        }
      }
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  (__return_storage_ptr__,__position,&local_51);
      }
      else {
        *__position._M_current = local_51;
        ppuVar1 = &(__return_storage_ptr__->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t>
BPBase::GetTransportIDs(const std::vector<std::string> &transportsTypes) const noexcept
{
    auto lf_GetTransportID = [](const std::string method) -> uint8_t {
        int id = METHOD_UNKNOWN;
        if (method == "File_NULL")
        {
            id = METHOD_NULL;
        }
        else if (method == "File_POSIX")
        {
            id = METHOD_POSIX;
        }
        else if (method == "File_fstream")
        {
            id = METHOD_FSTREAM;
        }
        else if (method == "File_stdio")
        {
            id = METHOD_FILE;
        }
        else if (method == "WAN_zmq")
        {
            id = METHOD_ZMQ;
        }

        return static_cast<uint8_t>(id);
    };

    std::vector<uint8_t> transportsIDs;
    transportsIDs.reserve(transportsTypes.size());

    for (const std::string &transportType : transportsTypes)
    {
        transportsIDs.push_back(lf_GetTransportID(transportType));
    }

    return transportsIDs;
}